

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_receive_hostname
          (udp_tracker_connection *this,string_view hostname,span<const_char> buf)

{
  bool bVar1;
  
  bVar1 = on_receive(this,&this->m_target,buf);
  return bVar1;
}

Assistant:

bool udp_tracker_connection::on_receive_hostname(string_view const hostname
		, span<char const> buf)
	{
		TORRENT_UNUSED(hostname);
		// just ignore the hostname this came from, pretend that
		// it's from the same endpoint we sent it to (i.e. the same
		// port). We have so many other ways of confirming this packet
		// comes from the tracker anyway, so it's not a big deal
		return on_receive(m_target, buf);
	}